

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O1

Roaring * __thiscall doublechecked::Roaring::operator^=(Roaring *this,Roaring *r)

{
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  long lVar3;
  const_iterator __position;
  _Rb_tree_const_iterator<unsigned_int> __first;
  _Rb_tree_header *__last;
  
  roaring_bitmap_xor_inplace((roaring_bitmap_t *)this,(roaring_bitmap_t *)r);
  this_00 = &this->check;
  __position._M_node = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(&this_00->_M_t,&(r->check)._M_t);
  }
  else {
    __first._M_node = (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    __last = &(r->check)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__first._M_node != __last) {
      _Var2 = __position._M_node[1]._M_color;
      lVar3 = std::_Rb_tree_decrement(&__last->_M_header);
      if ((_Var2 <= *(_Rb_tree_color *)(lVar3 + 0x20)) &&
         (_Var2 = __first._M_node[1]._M_color, lVar3 = std::_Rb_tree_decrement(&p_Var1->_M_header),
         _Var2 <= *(_Rb_tree_color *)(lVar3 + 0x20))) {
        do {
          while( true ) {
            if ((_Rb_tree_header *)__first._M_node == __last) {
              return this;
            }
            if ((_Rb_tree_header *)__position._M_node != p_Var1) break;
LAB_0010830b:
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)this_00,&__first._M_node[1]._M_color);
LAB_00108313:
            __first._M_node = (_Base_ptr)std::_Rb_tree_increment(__first._M_node);
          }
          if (__position._M_node[1]._M_color == __first._M_node[1]._M_color) {
            __position._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                 ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                     *)this_00,__position);
            goto LAB_00108313;
          }
          if (__first._M_node[1]._M_color <= __position._M_node[1]._M_color) goto LAB_0010830b;
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        } while( true );
      }
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_int>>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)this_00,__first,(_Rb_tree_const_iterator<unsigned_int>)__last);
    }
  }
  return this;
}

Assistant:

Roaring &operator^=(const Roaring &r) {
        plain ^= r.plain;

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end) {
            check = r.check;
        }  // this empty
        else if (r_it == r_it_end) {
        }  // r empty
        else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            check.insert(r.check.begin(), r.check.end());  // obvious disjoint
        } else
            while (r_it != r_it_end) {  // may overlap
                if (it == it_end) {
                    check.insert(*r_it);
                    ++r_it;
                } else if (*it == *r_it) {  // remove overlapping value
                    it = check.erase(it);   // returns *following* iterator
                    ++r_it;
                } else if (*it < *r_it) {
                    ++it;
                }  // keep value from this
                else {
                    check.insert(*r_it);
                    ++r_it;
                }  // add value from r
            }

        return *this;
    }